

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

bool test_SSTable_behavior(void)

{
  pointer pSVar1;
  SSTableHeader *pSVar2;
  SSTableIndex *pSVar3;
  long lVar4;
  bool bVar5;
  initializer_list<SSTableDataEntry> __l;
  allocator_type local_139;
  SSTableData data;
  SSTable s;
  SSTableDataEntry local_e0;
  SSTableDataEntry local_a0;
  SSTableDataEntry local_60;
  
  SSTableDataEntry::SSTableDataEntry((SSTableDataEntry *)&s,false,0xbc614e,1,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_e0,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_a0,true,0x4840e3f3,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_60,false,0x75998cb,4,"NIMO");
  __l._M_len = 4;
  __l._M_array = (iterator)&s;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector(&data,__l,&local_139);
  lVar4 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)((long)&s.file._M_pathname._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x20);
  SSTable::SSTable(&s);
  SSTable::fillData(&s,&data);
  pSVar2 = SSTable::getHeader(&s);
  if ((((pSVar2->key_min == 1) && (pSVar2->entries_count == 4)) && (pSVar2->key_max == 4)) &&
     (pSVar2->index_offset == 0x99)) {
    pSVar3 = SSTable::getIndex(&s);
    pSVar1 = (pSVar3->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (((((pSVar1->key == 1) && (pSVar1->offset == 0x20)) &&
         ((pSVar1[1].key == 2 && ((pSVar1[1].offset == 0x45 && (pSVar1[2].key == 3)))))) &&
        (pSVar1[2].offset == 99)) && (pSVar1[3].key == 4)) {
      bVar5 = pSVar1[3].offset == 0x7c;
      goto LAB_00103c52;
    }
  }
  bVar5 = false;
LAB_00103c52:
  SSTable::~SSTable(&s);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&data);
  return bVar5;
}

Assistant:

bool test_SSTable_behavior() {
    auto data = SSTableData{
            {false, 12345678,   1, "Hello,World!"},
            {false, 123455234,  2, "LLLLL"},
            {true,  1212212211, 3, ""},
            {false, 123312331,  4, "NIMO"}
    };
    auto s = SSTable{};
    s.fillData(data);

    auto *h = s.getHeader();

    if (h->key_min != 1 || h->entries_count != 4 || h->key_max != 4 || h->index_offset != 32 + (25 * 4 + 12 + 5 + 4)) {
        return false;
    }

    auto &index = *s.getIndex();

    if (
            index[0].key != 1 ||
            index[0].offset != 32 ||
            index[1].key != 2 ||
            index[1].offset != 69 ||
            index[2].key != 3 ||
            index[2].offset != 99 ||
            index[3].key != 4 ||
            index[3].offset != 124
            ) {
        return false;
    }

    return true;
}